

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O2

Vec2f __thiscall embree::string_to_Vec2f(embree *this,string *str)

{
  Vec2f VVar1;
  float fVar2;
  float fVar3;
  undefined4 extraout_XMM0_Db;
  size_t next;
  string local_40 [32];
  
  next = 0;
  fVar2 = std::__cxx11::stof(str,&next);
  std::__cxx11::string::substr((ulong)local_40,(ulong)str);
  std::__cxx11::string::operator=((string *)str,local_40);
  std::__cxx11::string::~string(local_40);
  fVar3 = std::__cxx11::stof(str,&next);
  *(float *)this = fVar2;
  *(float *)(this + 4) = fVar3;
  VVar1.field_0.field_0.y = (float)extraout_XMM0_Db;
  VVar1.field_0.field_0.x = fVar3;
  return (Vec2f)VVar1.field_0;
}

Assistant:

Vec2f string_to_Vec2f ( std::string str )
  {
    size_t next = 0;
    const float x = std::stof(str,&next); str = str.substr(next+1);
    const float y = std::stof(str,&next);
    return Vec2f(x,y);
  }